

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::UEFITool(UEFITool *this,QWidget *parent)

{
  UEFITool *pUVar1;
  QClipboard *pQVar2;
  SearchDialog *this_00;
  HexViewDialog *this_01;
  GoToAddressDialog *this_02;
  GoToBaseDialog *this_03;
  QCoreApplication *pQVar3;
  EVP_PKEY_CTX *ctx;
  QString local_150;
  QObject local_138 [8];
  QObject local_130 [8];
  QObject local_128 [8];
  QObject local_120 [8];
  QObject local_118 [8];
  QObject local_110 [8];
  QObject local_108 [8];
  QObject local_100 [8];
  QObject local_f8 [8];
  QObject local_f0 [8];
  QObject local_e8 [8];
  QObject local_e0 [8];
  QObject local_d8 [8];
  QObject local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  QObject local_b8 [8];
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [28];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  UEFITool *this_local;
  
  local_18 = parent;
  parent_local = (QWidget *)this;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QMainWindow::QMainWindow(&this->super_QMainWindow,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_0037a028;
  *(undefined ***)&this->field_0x10 = &PTR__UEFITool_0037a1e0;
  pUVar1 = (UEFITool *)operator_new(600);
  this->ui = pUVar1;
  QString::QString(&this->currentDir);
  QString::QString(&this->currentPath);
  QString::QString(&this->currentProgramPath);
  QFont::QFont(&this->currentFont);
  tr(&this->version,"NE alpha 71 (Apr 25 2025)",(char *)0x0,-1);
  this->markingEnabled = true;
  pQVar2 = (QClipboard *)QGuiApplication::clipboard();
  this->clipboard = pQVar2;
  Ui_UEFITool::setupUi((Ui_UEFITool *)this->ui,&this->super_QMainWindow);
  this_00 = (SearchDialog *)operator_new(0x50);
  SearchDialog::SearchDialog(this_00,(QWidget *)this);
  this->searchDialog = this_00;
  this_01 = (HexViewDialog *)operator_new(0x38);
  HexViewDialog::HexViewDialog(this_01,(QWidget *)this);
  this->hexViewDialog = this_01;
  this_02 = (GoToAddressDialog *)operator_new(0x30);
  GoToAddressDialog::GoToAddressDialog(this_02,(QWidget *)this);
  this->goToAddressDialog = this_02;
  this_03 = (GoToBaseDialog *)operator_new(0x30);
  GoToBaseDialog::GoToBaseDialog(this_03,(QWidget *)this);
  this->goToBaseDialog = this_03;
  this->model = (TreeModel *)0x0;
  this->ffsParser = (FfsParser *)0x0;
  this->ffsFinder = (FfsFinder *)0x0;
  this->ffsOps = (FfsOperations *)0x0;
  this->ffsBuilder = (FfsBuilder *)0x0;
  this->ffsReport = (FfsReport *)0x0;
  QObject::connect(local_38,*(char **)(this->ui + 0x30),(QObject *)"2triggered()",(char *)this,
                   0x25f003);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect(local_40,*(char **)(this->ui + 0x90),(QObject *)"2triggered()",(char *)this,
                   0x25f014);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,*(char **)(this->ui + 0x40),(QObject *)"2triggered()",(char *)this,
                   0x25f030);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QObject::connect(local_50,*(char **)(this->ui + 0x68),(QObject *)"2triggered()",(char *)this,
                   0x25f041);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect(local_58,*(char **)(this->ui + 0xa8),(QObject *)"2triggered()",(char *)this,
                   0x25f04b);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,*(char **)(this->ui + 0xb8),(QObject *)"2triggered()",(char *)this,
                   0x25f056);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect(local_68,*(char **)(this->ui + 0xc0),(QObject *)"2triggered()",(char *)this,
                   0x25f065);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QObject::connect(local_70,*(char **)(this->ui + 0x18),(QObject *)"2triggered()",(char *)this,
                   0x25f07c);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QObject::connect(local_78,*(char **)(this->ui + 0x20),(QObject *)"2triggered()",(char *)this,
                   0x25f08b);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::connect(local_80,*(char **)(this->ui + 0x98),(QObject *)"2triggered()",(char *)this,
                   0x25f09a);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QObject::connect(local_88,*(char **)(this->ui + 0x38),(QObject *)"2triggered()",(char *)this,
                   0x25f0b5);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QObject::connect(local_90,*(char **)(this->ui + 8),(QObject *)"2triggered()",(char *)this,0x25f0c3
                  );
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QObject::connect(local_98,*(char **)this->ui,(QObject *)"2triggered()",(char *)this,0x25f0d3);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::connect(local_a0,*(char **)(this->ui + 0x10),(QObject *)"2triggered()",(char *)this,
                   0x25f0e2);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QObject::connect(local_a8,*(char **)(this->ui + 0x78),(QObject *)"2triggered()",(char *)this,
                   0x25f0f1);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QObject::connect(local_b0,*(char **)(this->ui + 0x28),(QObject *)"2triggered()",(char *)this,
                   0x25f100);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  QObject::connect(local_b8,*(char **)(this->ui + 0x48),(QObject *)"2triggered()",(char *)this,
                   0x25f10a);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  QObject::connect(local_c0,*(char **)(this->ui + 0x80),(QObject *)"2triggered()",(char *)this,
                   0x25f115);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QObject::connect(local_c8,*(char **)(this->ui + 0x88),(QObject *)"2triggered()",(char *)this,
                   0x25f124);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  QObject::connect(local_d0,*(char **)(this->ui + 0x70),(QObject *)"2triggered()",(char *)this,
                   0x25f137);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  QObject::connect(local_d8,*(char **)(this->ui + 0x50),(QObject *)"2triggered()",(char *)this,
                   0x25f148);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  QObject::connect(local_e0,*(char **)(this->ui + 0x58),(QObject *)"2triggered()",(char *)this,
                   0x25f151);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  QObject::connect(local_e8,*(char **)(this->ui + 0x60),(QObject *)"2triggered()",(char *)this,
                   0x25f15c);
  QMetaObject::Connection::~Connection((Connection *)local_e8);
  QObject::connect(local_f0,*(char **)(this->ui + 0xa0),(QObject *)"2triggered()",(char *)this,
                   0x25f164);
  QMetaObject::Connection::~Connection((Connection *)local_f0);
  QObject::connect(local_f8,*(char **)(this->ui + 0xb0),(QObject *)"2triggered()",(char *)this,
                   0x25f170);
  QMetaObject::Connection::~Connection((Connection *)local_f8);
  QObject::connect(local_100,*(char **)(this->ui + 0xd0),(QObject *)"2triggered()",(char *)this,
                   0x25f17c);
  QMetaObject::Connection::~Connection((Connection *)local_100);
  QObject::connect(local_108,*(char **)(this->ui + 200),(QObject *)"2triggered()",(char *)this,
                   0x25f18b);
  QMetaObject::Connection::~Connection((Connection *)local_108);
  QObject::connect(local_110,*(char **)(this->ui + 0xe8),(QObject *)"2triggered()",(char *)this,
                   0x25f19f);
  QMetaObject::Connection::~Connection((Connection *)local_110);
  QObject::connect(local_118,*(char **)(this->ui + 0xf0),(QObject *)"2triggered()",(char *)this,
                   0x25f1b5);
  QMetaObject::Connection::~Connection((Connection *)local_118);
  QObject::connect(local_120,*(char **)(this->ui + 0xf8),(QObject *)"2triggered()",(char *)this,
                   0x25f1d0);
  QMetaObject::Connection::~Connection((Connection *)local_120);
  QObject::connect(local_128,*(char **)(this->ui + 0xe0),(QObject *)"2triggered()",(char *)this,
                   0x25f1e9);
  QMetaObject::Connection::~Connection((Connection *)local_128);
  QObject::connect(local_130,*(char **)(this->ui + 0xd8),(QObject *)"2toggled(bool)",(char *)this,
                   0x25f20a);
  QMetaObject::Connection::~Connection((Connection *)local_130);
  pQVar3 = QCoreApplication::instance();
  QObject::connect(local_138,(char *)pQVar3,(QObject *)"2aboutToQuit()",(char *)this,0x25f237);
  QMetaObject::Connection::~Connection((Connection *)local_138);
  QWidget::setAcceptDrops(SUB81(this,0));
  QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
  QString::operator=(&this->currentDir,".");
  QString::QString(&local_150,":/guids.csv");
  ctx = (EVP_PKEY_CTX *)0x0;
  initGuidDatabase(&local_150,(UINT32 *)0x0);
  QString::~QString(&local_150);
  init(this,ctx);
  readSettings(this);
  return;
}

Assistant:

UEFITool::UEFITool(QWidget *parent) :
QMainWindow(parent),
ui(new Ui::UEFITool),
version(tr(PROGRAM_VERSION)),
markingEnabled(true)
{
    clipboard = QApplication::clipboard();
    
    // Create UI
    ui->setupUi(this);
    searchDialog = new SearchDialog(this);
    hexViewDialog = new HexViewDialog(this);
    goToAddressDialog = new GoToAddressDialog(this);
    goToBaseDialog = new GoToBaseDialog(this);
    model = NULL;
    ffsParser = NULL;
    ffsFinder = NULL;
    ffsOps = NULL;
    ffsBuilder = NULL;
    ffsReport = NULL;
    
    // Connect signals to slots
    connect(ui->actionOpenImageFile, SIGNAL(triggered()), this, SLOT(openImageFile()));
    connect(ui->actionOpenImageFileInNewWindow, SIGNAL(triggered()), this, SLOT(openImageFileInNewWindow()));
    connect(ui->actionSaveImageFile, SIGNAL(triggered()), this, SLOT(saveImageFile()));
    connect(ui->actionSearch, SIGNAL(triggered()), this, SLOT(search()));
    connect(ui->actionHexView, SIGNAL(triggered()), this, SLOT(hexView()));
    connect(ui->actionBodyHexView, SIGNAL(triggered()), this, SLOT(bodyHexView()));
    connect(ui->actionUncompressedHexView, SIGNAL(triggered()), this, SLOT(uncompressedHexView()));
    connect(ui->actionExtract, SIGNAL(triggered()), this, SLOT(extractAsIs()));
    connect(ui->actionExtractBody, SIGNAL(triggered()), this, SLOT(extractBody()));
    connect(ui->actionExtractBodyUncompressed, SIGNAL(triggered()), this, SLOT(extractBodyUncompressed()));
    connect(ui->actionInsertInto, SIGNAL(triggered()), this, SLOT(insertInto()));
    connect(ui->actionInsertBefore, SIGNAL(triggered()), this, SLOT(insertBefore()));
    connect(ui->actionInsertAfter, SIGNAL(triggered()), this, SLOT(insertAfter()));
    connect(ui->actionReplace, SIGNAL(triggered()), this, SLOT(replaceAsIs()));
    connect(ui->actionReplaceBody, SIGNAL(triggered()), this, SLOT(replaceBody()));
    connect(ui->actionRemove, SIGNAL(triggered()), this, SLOT(remove()));
    connect(ui->actionRebuild, SIGNAL(triggered()), this, SLOT(rebuild()));
    connect(ui->actionMessagesCopy, SIGNAL(triggered()), this, SLOT(copyMessage()));
    connect(ui->actionMessagesCopyAll, SIGNAL(triggered()), this, SLOT(copyAllMessages()));
    connect(ui->actionMessagesClear, SIGNAL(triggered()), this, SLOT(clearMessages()));
    connect(ui->actionAbout, SIGNAL(triggered()), this, SLOT(about()));
    connect(ui->actionAboutQt, SIGNAL(triggered()), this, SLOT(aboutQt()));
    connect(ui->actionQuit, SIGNAL(triggered()), this, SLOT(exit()));
    connect(ui->actionGoToData, SIGNAL(triggered()), this, SLOT(goToData()));
    connect(ui->actionGoToBase, SIGNAL(triggered()), this, SLOT(goToBase()));
    connect(ui->actionGoToAddress, SIGNAL(triggered()), this, SLOT(goToAddress()));
    connect(ui->actionLoadGuidDatabase, SIGNAL(triggered()), this, SLOT(loadGuidDatabase()));
    connect(ui->actionUnloadGuidDatabase, SIGNAL(triggered()), this, SLOT(unloadGuidDatabase()));
    connect(ui->actionLoadDefaultGuidDatabase, SIGNAL(triggered()), this, SLOT(loadDefaultGuidDatabase()));
    connect(ui->actionExportDiscoveredGuids, SIGNAL(triggered()), this, SLOT(exportDiscoveredGuids()));
    connect(ui->actionGenerateReport, SIGNAL(triggered()), this, SLOT(generateReport()));
    connect(ui->actionToggleBootGuardMarking, SIGNAL(toggled(bool)), this, SLOT(toggleBootGuardMarking(bool)));
    connect(QCoreApplication::instance(), SIGNAL(aboutToQuit()), this, SLOT(writeSettings()));
    
    // Enable Drag-and-Drop actions
    setAcceptDrops(true);
    
    // Disable Builder tab, doesn't work right now
    ui->messagesTabWidget->setTabEnabled(TAB_BUILDER, false);
    
    // Set current directory
    currentDir = ".";
    
    // Load built-in GUID database
    initGuidDatabase(":/guids.csv");
    
    // Initialize non-persistent data
    init();
    
    // Read stored settings
    readSettings();
}